

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O0

IHEVCD_ERROR_T ihevcd_parse_vps(codec_t *ps_codec)

{
  UWORD32 UVar1;
  UWORD32 UVar2;
  bitstrm_t *ps_bitstrm_00;
  undefined1 *puVar3;
  long in_RDI;
  bitstrm_t *ps_bitstrm;
  vps_t *ps_vps;
  WORD32 vps_id;
  WORD32 value;
  WORD32 i;
  IHEVCD_ERROR_T ret;
  int local_34;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar4;
  IHEVCD_ERROR_T local_4;
  
  uVar4 = 0;
  ps_bitstrm_00 = (bitstrm_t *)(in_RDI + 0x218);
  UVar1 = ihevcd_bits_get(ps_bitstrm_00,4);
  if ((int)UVar1 < 0x10) {
    puVar3 = (undefined1 *)(*(long *)(in_RDI + 0x380) + (long)(int)UVar1 * 0x1c0);
    *puVar3 = (char)UVar1;
    UVar2 = ihevcd_bits_get(ps_bitstrm_00,2);
    if (UVar2 != 3) {
      __assert_fail("(value == 3)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/decoder/ihevcd_parse_headers.c"
                    ,0x4a1,"IHEVCD_ERROR_T ihevcd_parse_vps(codec_t *)");
    }
    ihevcd_bits_get(ps_bitstrm_00,6);
    UVar2 = ihevcd_bits_get(ps_bitstrm_00,3);
    puVar3[3] = (char)UVar2 + '\x01';
    if ('\x06' < (char)puVar3[3]) {
      __assert_fail("(ps_vps->i1_vps_max_sub_layers < 7)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/decoder/ihevcd_parse_headers.c"
                    ,0x4ab,"IHEVCD_ERROR_T ihevcd_parse_vps(codec_t *)");
    }
    UVar2 = ihevcd_bits_get(ps_bitstrm_00,1);
    puVar3[1] = (char)UVar2;
    UVar2 = ihevcd_bits_get(ps_bitstrm_00,0x10);
    if (UVar2 != 0xffff) {
      __assert_fail("(value == 0xFFFF)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/decoder/ihevcd_parse_headers.c"
                    ,0x4b1,"IHEVCD_ERROR_T ihevcd_parse_vps(codec_t *)");
    }
    local_4 = ihevcd_profile_tier_level
                        ((bitstrm_t *)CONCAT44(uVar4,in_stack_ffffffffffffffe8),
                         (profile_tier_lvl_info_t *)CONCAT44(0xffff,UVar1),
                         (WORD32)((ulong)puVar3 >> 0x20),(WORD32)puVar3);
    UVar2 = ihevcd_bits_get(ps_bitstrm_00,1);
    puVar3[2] = (char)UVar2;
    if (puVar3[2] == '\0') {
      local_34 = (char)puVar3[3] + -1;
    }
    else {
      local_34 = 0;
    }
    for (; local_34 < (char)puVar3[3]; local_34 = local_34 + 1) {
      UVar2 = ihevcd_uev((bitstrm_t *)CONCAT44(UVar2,UVar1));
      puVar3[(long)local_34 + 4] = (char)UVar2;
      UVar2 = ihevcd_uev((bitstrm_t *)CONCAT44(UVar2,UVar1));
      puVar3[(long)local_34 + 0xb] = (char)UVar2;
      UVar2 = ihevcd_uev((bitstrm_t *)CONCAT44(UVar2,UVar1));
      puVar3[(long)local_34 + 0x12] = (char)UVar2;
    }
    UVar2 = ihevcd_bits_get(ps_bitstrm_00,6);
    ihevcd_uev((bitstrm_t *)CONCAT44(UVar2,UVar1));
    ihevcd_bits_get(ps_bitstrm_00,1);
  }
  else {
    *(undefined4 *)(in_RDI + 0x3a8) = 0x3d0;
    local_4 = IHEVCD_UNSUPPORTED_VPS_ID;
  }
  return local_4;
}

Assistant:

IHEVCD_ERROR_T ihevcd_parse_vps(codec_t *ps_codec)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 i;
    WORD32 value;
    WORD32 vps_id;
    vps_t *ps_vps;
    bitstrm_t *ps_bitstrm = &ps_codec->s_parse.s_bitstrm;
    BITS_PARSE("vps_video_parameter_set_id", value, ps_bitstrm, 4);
    vps_id = value;

    if(vps_id >= MAX_VPS_CNT)
    {
        ps_codec->s_parse.i4_error_code = IHEVCD_UNSUPPORTED_VPS_ID;
        return IHEVCD_UNSUPPORTED_VPS_ID;
    }


    ps_vps = (ps_codec->s_parse.ps_vps_base + vps_id);

    ps_vps->i1_vps_id = vps_id;

    BITS_PARSE("vps_reserved_three_2bits", value, ps_bitstrm, 2);
    ASSERT(value == 3);

    BITS_PARSE("vps_max_layers_minus1", value, ps_bitstrm, 6);
    //ps_vps->i1_vps_max_layers = value + 1;



    BITS_PARSE("vps_max_sub_layers_minus1", value, ps_bitstrm, 3);
    ps_vps->i1_vps_max_sub_layers = value + 1;

    ASSERT(ps_vps->i1_vps_max_sub_layers < VPS_MAX_SUB_LAYERS);

    BITS_PARSE("vps_temporal_id_nesting_flag", value, ps_bitstrm, 1);
    ps_vps->i1_vps_temporal_id_nesting_flag = value;

    BITS_PARSE("vps_reserved_ffff_16bits", value, ps_bitstrm, 16);
    ASSERT(value == 0xFFFF);
    // profile_and_level( 1, vps_max_sub_layers_minus1 )
    ret = ihevcd_profile_tier_level(ps_bitstrm, &(ps_vps->s_ptl),
                                    1, (ps_vps->i1_vps_max_sub_layers - 1));

    BITS_PARSE("vps_sub_layer_ordering_info_present_flag", value, ps_bitstrm, 1);
    ps_vps->i1_sub_layer_ordering_info_present_flag = value;
    i = (ps_vps->i1_sub_layer_ordering_info_present_flag ?
                    0 : (ps_vps->i1_vps_max_sub_layers - 1));
    for(; i < ps_vps->i1_vps_max_sub_layers; i++)
    {
        UEV_PARSE("vps_max_dec_pic_buffering[i]", value, ps_bitstrm);
        ps_vps->ai1_vps_max_dec_pic_buffering[i] = value;

        /* vps_num_reorder_pics (no max) used in print in order to match with HM */
        UEV_PARSE("vps_num_reorder_pics[i]", value, ps_bitstrm);
        ps_vps->ai1_vps_max_num_reorder_pics[i] = value;

        UEV_PARSE("vps_max_latency_increase[i]", value, ps_bitstrm);
        ps_vps->ai1_vps_max_latency_increase[i] = value;
    }



    BITS_PARSE("vps_max_layer_id", value, ps_bitstrm, 6);
    //ps_vps->i1_vps_max_layer_id  = value;

    UEV_PARSE("vps_num_layer_sets_minus1", value, ps_bitstrm);
    //ps_vps->i1_vps_num_layer_sets  = value + 1;

    BITS_PARSE("vps_timing_info_present_flag", value, ps_bitstrm, 1);
    //ps_vps->i1_vps_timing_info_present_flag  = value;



    return ret;
}